

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O3

void __thiscall
MacProj::mac_project
          (MacProj *this,int level,MultiFab *u_mac,MultiFab *S,Real dt,Real time,MultiFab *divu,
          int have_divu,BCRec *density_math_bc,bool increment_vel_register)

{
  int iVar1;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> this_00;
  pointer ppAVar2;
  AmrLevel *pAVar3;
  __uniq_ptr_data<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>,_true,_true> this_01
  ;
  Real RVar4;
  char cVar5;
  bool bVar6;
  _Head_base<0UL,_amrex::MultiFab_*,_false> this_02;
  MultiFab *pMVar7;
  undefined8 uVar8;
  int dir_1;
  MultiFab *pMVar9;
  MultiFab *pMVar10;
  int dir;
  _Head_base<0UL,_amrex::MultiFab_*,_false> cphi;
  long lVar11;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_3a0;
  undefined1 local_370 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_360 [15];
  Array<MultiFab_*,_3> fluxes;
  Array<MultiFab_*,_3> umac;
  MultiFab rho;
  
  if (verbose != 0) {
    local_370._8_8_ = amrex::OutStream();
    local_370._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
    local_370._0_4_ = *(int *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_360);
    *(undefined8 *)
     ((long)&avStack_360[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     avStack_360[0].
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)
          ((long)&((ArenaInfo *)(local_370._8_8_ + 8))->release_threshold +
          (long)(*(_func_int ***)local_370._8_8_)[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)avStack_360,"... mac_project at level ",0x19);
    std::ostream::operator<<((ostringstream *)avStack_360,level);
    rho.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_360,(char *)&rho,1);
    amrex::Print::~Print((Print *)local_370);
  }
  this_00._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->parent->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[level]._M_t;
  if ((this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level == level) {
    ppAVar2 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar3 = ppAVar2[level];
    this_02._M_head_impl = (MultiFab *)operator_new(0x180);
    local_370._0_4_ = 1;
    local_370._4_4_ = 0;
    local_370._8_8_ = (Arena *)0x0;
    avStack_360[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_360[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_360[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::MultiFab
              (this_02._M_head_impl,&pAVar3->grids,&pAVar3->dmap,1,1,(MFInfo *)local_370,
               (FabFactory<amrex::FArrayBox> *)
               (ppAVar2[level]->m_factory)._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_360);
    local_3a0._M_head_impl = this_02._M_head_impl;
  }
  else {
    this_02._M_head_impl =
         *(MultiFab **)
          &(this->mac_phi_crse).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[level]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    local_3a0._M_head_impl = (MultiFab *)0x0;
  }
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&(this_02._M_head_impl)->super_FabArray<amrex::FArrayBox>,0.0,0,
             *(int *)((long)this_02._M_head_impl + 0xcc),
             (IntVect *)((long)this_02._M_head_impl + 0xc0));
  pMVar7 = NavierStokesBase::get_rho
                     ((NavierStokesBase *)
                      this_00._M_t.
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,time);
  uVar8 = 0;
  pMVar9 = (MultiFab *)0x1;
  pMVar10 = (MultiFab *)0x1;
  amrex::MultiFab::Copy(S,pMVar7,0,3,1,1);
  bVar6 = OutFlowBC::HasOutFlowBC(this->phys_bc);
  if ((bVar6 && have_divu != 0) && (do_outflow_bcs != 0)) {
    set_outflow_bcs(this,level,this_02._M_head_impl,
                    (MultiFab *)CONCAT71((int7)((ulong)uVar8 >> 8),have_divu == 0),pMVar9,pMVar10);
  }
  if (level == 0) {
    cphi._M_head_impl = (MultiFab *)0x0;
  }
  else {
    cphi._M_head_impl =
         *(MultiFab **)
          &(this->mac_phi_crse).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)level + -1]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  }
  local_370._0_4_ = 1;
  local_370._4_4_ = 0;
  local_370._8_8_ = (Arena *)0x0;
  avStack_360[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_360[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_360[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (&rho,&(S->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(S->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,
             (S->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0],
             (MFInfo *)local_370,
             *(FabFactory<amrex::FArrayBox> **)
              ((long)(this->parent->amr_level).
                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[level]._M_t + 0x218));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_360);
  amrex::MultiFab::Copy
            (&rho,S,3,0,1,(S->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
  umac._M_elems[1] = u_mac + 1;
  umac._M_elems[2] = u_mac + 2;
  fluxes._M_elems[0] = (MultiFab *)0x0;
  fluxes._M_elems[1] = (MultiFab *)0x0;
  fluxes._M_elems[2] = (MultiFab *)0x0;
  umac._M_elems[0] = u_mac;
  mlmg_mac_solve((MacProj *)&fluxes,this->parent,cphi._M_head_impl,this->phys_bc,density_math_bc,
                 level,mac_tol,mac_abs_tol,2.0 / dt,&rho,divu,&umac,this_02._M_head_impl,&fluxes);
  if (verbose != 0) {
    check_div_cond(this,level,u_mac);
  }
  if (increment_vel_register) {
    pMVar7 = (MultiFab *)
             ((long)this_00._M_t.
                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x540);
    if (level < this->finest_level) {
      this_01.super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>.
      _M_t.super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
      super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl =
           (this->mac_reg).
           super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)level + 1]._M_t.
           super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>;
      amrex::BndryRegister::setVal
                ((BndryRegister *)
                 this_01.
                 super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
                 .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl,0.0);
      lVar11 = 0;
      pMVar9 = pMVar7;
      pMVar10 = u_mac;
      do {
        amrex::FluxRegister::CrseInit
                  ((FluxRegister *)
                   this_01.
                   super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
                   .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl,pMVar10,pMVar9,
                   (int)lVar11,0,0,1,-1.0,COPY);
        lVar11 = lVar11 + 1;
        pMVar9 = pMVar9 + 1;
        pMVar10 = pMVar10 + 1;
      } while (lVar11 != 3);
      if (verbose != 0) {
        RVar4 = amrex::FluxRegister::SumReg
                          ((FluxRegister *)
                           this_01.
                           super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
                           .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl,0);
        local_370._8_8_ = amrex::OutStream();
        local_370._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
        local_370._0_4_ = *(int *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_360);
        *(undefined8 *)
         ((long)&avStack_360[0].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         avStack_360[0].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)
              ((long)&((ArenaInfo *)(local_370._8_8_ + 8))->release_threshold +
              (long)(*(_func_int ***)local_370._8_8_)[-3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_360,"LEVEL ",6);
        std::ostream::operator<<((ostringstream *)avStack_360,level);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)avStack_360," MACREG: CrseInit sum = ",0x18);
        std::ostream::_M_insert<double>(RVar4);
        cVar5 = (char)(ostringstream *)avStack_360;
        std::ios::widen((char)avStack_360[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar5
                       );
        std::ostream::put(cVar5);
        std::ostream::flush();
        amrex::Print::~Print((Print *)local_370);
      }
    }
    if (0 < level) {
      iVar1 = (this->parent->n_cycle).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [level];
      lVar11 = 0;
      pMVar9 = u_mac;
      do {
        amrex::FluxRegister::FineAdd
                  ((FluxRegister *)
                   (this->mac_reg).
                   super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[level]._M_t.
                   super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>
                   ,pMVar9,pMVar7,(int)lVar11,0,0,1,1.0 / (double)iVar1);
        lVar11 = lVar11 + 1;
        pMVar7 = pMVar7 + 1;
        pMVar9 = pMVar9 + 1;
      } while (lVar11 != 3);
      if (verbose != 0) {
        RVar4 = amrex::FluxRegister::SumReg
                          ((FluxRegister *)
                           (this->mac_reg).
                           super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[level]._M_t.
                           super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>
                           ,0);
        local_370._8_8_ = amrex::OutStream();
        local_370._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
        local_370._0_4_ = *(int *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_360);
        *(undefined8 *)
         ((long)&avStack_360[0].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         avStack_360[0].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)
              ((long)&((ArenaInfo *)(local_370._8_8_ + 8))->release_threshold +
              (long)(*(_func_int ***)local_370._8_8_)[-3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)avStack_360,"LEVEL ",6);
        std::ostream::operator<<((ostringstream *)avStack_360,level);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)avStack_360," MACREG: FineAdd sum = ",0x17);
        std::ostream::_M_insert<double>(RVar4);
        cVar5 = (char)(ostringstream *)avStack_360;
        std::ios::widen((char)avStack_360[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar5
                       );
        std::ostream::put(cVar5);
        std::ostream::flush();
        amrex::Print::~Print((Print *)local_370);
      }
    }
  }
  if (check_umac_periodicity != 0) {
    test_umac_periodic(this,level,u_mac);
  }
  amrex::MultiFab::~MultiFab(&rho);
  if (local_3a0._M_head_impl != (MultiFab *)0x0) {
    (*(*(_func_int ***)local_3a0._M_head_impl)[1])();
  }
  return;
}

Assistant:

void
MacProj::mac_project (int             level,
                      MultiFab*       u_mac,
                      MultiFab&       S,
                      Real            dt,
                      Real            time,
                      const MultiFab& divu,
                      int             have_divu,
                      const BCRec&    density_math_bc,
                      bool            increment_vel_register )
{
    BL_PROFILE("MacProj::mac_project()");
    if (verbose) amrex::Print() << "... mac_project at level " << level << '\n';

    const BoxArray& grids      = LevelData[level]->boxArray();
    const DistributionMapping& dmap = LevelData[level]->DistributionMap();
    const int       max_level  = parent->maxLevel();
    MultiFab*       mac_phi    = 0;
    NavierStokesBase&   ns     = *(NavierStokesBase*) &(parent->getLevel(level));
    const MultiFab*     area   = ns.Area();
    //
    // If finest level possible no need to make permanent mac_phi for bcs.
    //
    std::unique_ptr<MultiFab> raii;
    if (level == max_level) {
        raii.reset(new MultiFab(grids,dmap,1,1, MFInfo(), LevelData[level]->Factory()));
        mac_phi = raii.get();
    } else {
        mac_phi = mac_phi_crse[level].get();
    }

    mac_phi->setVal(0.0);
    //
    // HACK!!!
    //
    // Some of the routines we call assume that density has one valid
    // ghost cell.  We enforce that assumption by setting it here.
    //
    const MultiFab& rhotime = ns.get_rho(time);
    MultiFab::Copy(S, rhotime, 0, Density, 1, 1);

    if (OutFlowBC::HasOutFlowBC(phys_bc) && have_divu && do_outflow_bcs) {
        set_outflow_bcs(level, mac_phi, u_mac, S, divu);
    }

    //
    //  Set up the mac projection
    //
    const Real rhs_scale = 2.0/dt;

    const MultiFab* cphi = (level == 0) ? nullptr : mac_phi_crse[level-1].get();

    // Set bcoefs to the average of Density at the faces
    // In the EB case, they will be defined at the Face Centroid
    MultiFab rho(S.boxArray(),S.DistributionMap(), 1, S.nGrow(),
                 MFInfo(), (parent->getLevel(level)).Factory());
    MultiFab::Copy(rho, S, Density, 0, 1, S.nGrow()); // Extract rho component from S

    Array<MultiFab*,AMREX_SPACEDIM>  umac;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        umac[idim]= &(u_mac[idim]);

    Array<MultiFab*,AMREX_SPACEDIM>  fluxes;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
      // We don't need the fluxes, so nullptr means we won't compute them
      fluxes[idim]= nullptr;

    //
    // Perform projection
    //
    mlmg_mac_solve(parent, cphi, *phys_bc, density_math_bc, level,
		   mac_tol, mac_abs_tol, rhs_scale,
		   rho, divu, umac, mac_phi, fluxes);

    //
    // Test that u_mac is divergence free
    //
    if (verbose)
        check_div_cond(level, u_mac);

    if (increment_vel_register)
    {
        //
        // Store advection velocities in mac registers at crse/fine boundaries.
        //
        // Initialize advection velocity registers with coarse grid velocity.
        //
        if (level < finest_level)
        {
            FluxRegister& mr = *mac_reg[level+1];

            mr.setVal(0.0);

            for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
            {
                mr.CrseInit(u_mac[dir],area[dir],dir,0,0,1,-1.0);
            }

            if (verbose)
            {
                Real sumreg = mr.SumReg(0);

                amrex::Print() << "LEVEL " << level << " MACREG: CrseInit sum = " << sumreg << std::endl;
            }
        }
        //
        // Increment in fine grid velocity to velocity registers.
        //
        if (level > 0)
        {
            const Real mult = 1.0/Real(parent->nCycle(level));

            for (int dir = 0; dir < BL_SPACEDIM; dir++)
            {
                mac_reg[level]->FineAdd(u_mac[dir],area[dir],dir,0,0,1,mult);
            }

            if (verbose)
            {
                Real sumreg = mac_reg[level]->SumReg(0);
                amrex::Print() << "LEVEL "                  << level
                               << " MACREG: FineAdd sum = " << sumreg << std::endl;
            }
        }
    }

    if (check_umac_periodicity)
        test_umac_periodic(level,u_mac);

}